

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O2

bool ConvexDecomposition::featureMatch
               (CTri *m,CTriVector *tris,ConvexDecompInterface *callback,CTriVector *input_mesh)

{
  Vector3d *a;
  Vector3d *this;
  Vector3d *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  CTri *t;
  pointer this_01;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [64];
  CTri nearest;
  float local_d0;
  CTri local_a8;
  undefined1 extraout_var [60];
  
  m->mConcavity = 0.0;
  a = &m->mNormal;
  this = &m->mP2;
  this_00 = &m->mP3;
  bVar3 = false;
  this_01 = (tris->
            super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = 0.707;
  for (; this_01 !=
         (tris->
         super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>).
         _M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    bVar2 = CTri::samePlane(this_01,m);
    if (bVar2) goto LAB_00e2d679;
    fVar4 = Vector3d::Dot(&this_01->mNormal,a);
    if (local_d0 < fVar4) {
      fVar5 = CTri::planeDistance(this_01,&m->mP1);
      fVar6 = CTri::planeDistance(this_01,this);
      fVar7 = CTri::planeDistance(this_01,this_00);
      if (((0.001 < fVar5) || (0.001 < fVar6)) || (0.001 < fVar7)) {
        CTri::raySect(this_01,&m->mP1,a,&m->mNear1);
        CTri::raySect(this_01,this,a,&m->mNear2);
        CTri::raySect(this_01,this_00,a,&m->mNear3);
        CTri::operator=(&local_a8,this_01);
        bVar3 = true;
        local_d0 = fVar4;
      }
    }
  }
  if (bVar3) {
    fVar4 = Vector3d::Distance(&m->mP1,&m->mNear1);
    m->mC1 = fVar4;
    fVar4 = Vector3d::Distance(this,&m->mNear2);
    m->mC2 = fVar4;
    auVar8._0_4_ = Vector3d::Distance(this_00,&m->mNear3);
    auVar8._4_60_ = extraout_var;
    m->mC3 = auVar8._0_4_;
    bVar3 = true;
    fVar4 = m->mC1;
    m->mConcavity = fVar4;
    auVar1 = vmaxss_avx(ZEXT416((uint)m->mC2),ZEXT416((uint)fVar4));
    if ((fVar4 < m->mC2) || (auVar1._0_4_ < auVar8._0_4_)) {
      auVar1 = vmaxss_avx(auVar8._0_16_,auVar1);
      m->mConcavity = auVar1._0_4_;
    }
  }
  else {
LAB_00e2d679:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool featureMatch(CTri &m,const CTriVector &tris,ConvexDecompInterface *callback,const CTriVector &input_mesh)
{

  bool ret = false;

  float neardot = 0.707f;

  m.mConcavity = 0;

	//gLog->Display("*********** FEATURE MATCH *************\r\n");
	//gLog->Display("Plane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", m.mNormal.x, m.mNormal.y, m.mNormal.z, m.mPlaneD );
	//gLog->Display("*********************************************\r\n");

	CTriVector::const_iterator i;

	CTri nearest;


	for (i=tris.begin(); i!=tris.end(); ++i)
	{
		const CTri &t = (*i);


  	//gLog->Display("   HullPlane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", t.mNormal.x, t.mNormal.y, t.mNormal.z, t.mPlaneD );

		if ( t.samePlane(m) )
		{
			//gLog->Display("*** PLANE MATCH!!!\r\n");
			ret = false;
			break;
		}

	  float dot = t.mNormal.Dot(m.mNormal);

	  if ( dot > neardot )
	  {

      float d1 = t.planeDistance( m.mP1 );
      float d2 = t.planeDistance( m.mP2 );
      float d3 = t.planeDistance( m.mP3 );

      if ( d1 > 0.001f || d2 > 0.001f || d3 > 0.001f ) // can't be near coplaner!
      {

  	  	neardot = dot;

        Vector3d n1,n2,n3;

        t.raySect( m.mP1, m.mNormal, m.mNear1 );
        t.raySect( m.mP2, m.mNormal, m.mNear2 );
        t.raySect( m.mP3, m.mNormal, m.mNear3 );

				nearest = t;

	  		ret = true;
		  }

	  }
	}

	if ( ret )
	{
    if ( 0 )
    {
      CTriVector::const_iterator i;
      for (i=input_mesh.begin(); i!=input_mesh.end(); ++i)
      {
        const CTri &c = (*i);
        if ( c.mI1 != m.mI1 && c.mI2 != m.mI2 && c.mI3 != m.mI3 )
        {
  			  c.clip( m.mP1, m.mNear1 );
				  c.clip( m.mP2, m.mNear2 );
				  c.clip( m.mP3, m.mNear3 );
        }
      }
    }

	  //gLog->Display("*********************************************\r\n");
  	//gLog->Display("   HullPlaneNearest: %0.4f,%0.4f,%0.4f   %0.4f\r\n", nearest.mNormal.x, nearest.mNormal.y, nearest.mNormal.z, nearest.mPlaneD );

		m.mC1 = m.mP1.Distance( m.mNear1 );
		m.mC2 = m.mP2.Distance( m.mNear2 );
		m.mC3 = m.mP3.Distance( m.mNear3 );

		m.mConcavity = m.mC1;

		if ( m.mC2 > m.mConcavity ) m.mConcavity = m.mC2;
		if ( m.mC3 > m.mConcavity ) m.mConcavity = m.mC3;

    #if 0
		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP2.Ptr(), m.mP3.Ptr(), 0x00FF00 );
		callback->ConvexDebugTri( m.mNear1.Ptr(), m.mNear2.Ptr(), m.mNear3.Ptr(), 0xFF0000 );

		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP1.Ptr(), m.mNear1.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP2.Ptr(), m.mP2.Ptr(), m.mNear2.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP3.Ptr(), m.mP3.Ptr(), m.mNear3.Ptr(), 0xFFFF00 );
    #endif

	}
	else
	{
		//gLog->Display("No match\r\n");
	}

	//gLog->Display("*********************************************\r\n");
	return ret;
}